

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

uint64_t helper_divu64(CPUS390XState_conflict *env,uint64_t ah,uint64_t al,uint64_t b)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  uintptr_t unaff_retaddr;
  __uint128_t q;
  __uint128_t a;
  ulong local_30;
  uint64_t ret;
  uint64_t b_local;
  uint64_t al_local;
  uint64_t ah_local;
  CPUS390XState_conflict *env_local;
  
  if (b == 0) {
    tcg_s390_program_interrupt_s390x(env,9,unaff_retaddr);
  }
  if (ah == 0) {
    env->retxl = al % b;
    local_30 = al / b;
  }
  else {
    auVar2 = __udivti3(al,ah,b);
    local_30 = auVar2._0_8_;
    uVar1 = __umodti3(al,ah,b,0);
    env->retxl = uVar1;
    q._0_1_ = auVar2[8];
    q._1_1_ = auVar2[9];
    q._2_1_ = auVar2[10];
    q._3_1_ = auVar2[0xb];
    q._4_1_ = auVar2[0xc];
    q._5_1_ = auVar2[0xd];
    q._6_1_ = auVar2[0xe];
    q._7_1_ = auVar2[0xf];
    auVar2[8] = -((char)q == '\0');
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2[9] = -(q._1_1_ == '\0');
    auVar2[10] = -(q._2_1_ == '\0');
    auVar2[0xb] = -(q._3_1_ == '\0');
    auVar2[0xc] = -(q._4_1_ == '\0');
    auVar2[0xd] = -(q._5_1_ == '\0');
    auVar2[0xe] = -(q._6_1_ == '\0');
    auVar2[0xf] = -(q._7_1_ == '\0');
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf)
        != 0xffff) {
      tcg_s390_program_interrupt_s390x(env,9,unaff_retaddr);
    }
  }
  return local_30;
}

Assistant:

uint64_t HELPER(divu64)(CPUS390XState *env, uint64_t ah, uint64_t al,
                        uint64_t b)
{
    uint64_t ret;
    /* Signal divide by zero.  */
    if (b == 0) {
        tcg_s390_program_interrupt(env, PGM_FIXPT_DIVIDE, GETPC());
    }
    if (ah == 0) {
        /* 64 -> 64/64 case */
        env->retxl = al % b;
        ret = al / b;
    } else {
        /* ??? Move i386 idivq helper to host-utils.  */
#ifdef CONFIG_INT128
        __uint128_t a = ((__uint128_t)ah << 64) | al;
        __uint128_t q = a / b;
        env->retxl = a % b;
        ret = q;
        if (ret != q) {
            tcg_s390_program_interrupt(env, PGM_FIXPT_DIVIDE, GETPC());
        }
#else
        /* 32-bit hosts would need special wrapper functionality - just abort if
           we encounter such a case; it's very unlikely anyways. */
        cpu_abort(env_cpu(env), "128 -> 64/64 division not implemented\n");
#endif
    }
    return ret;
}